

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O1

uint zvgSppPutc(uchar cc)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = 0x18;
  if (((byte)ZvgIO.ecpFlags & 3) == 0) {
    uVar1 = waitForDsrEQ(0x80,'\0',1000);
    if (uVar1 == 0xffffffff) {
      uVar1 = 0x16;
    }
    else {
      out((undefined2)ZvgIO.ecpData,cc);
      out((undefined2)ZvgIO.ecpData,cc);
      out((undefined2)ZvgIO.ecpData,cc);
      out((undefined2)ZvgIO.ecpData,cc);
      ZvgIO.ecpDcrState = ZvgIO.ecpDcrState | 1;
      out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
      uVar2 = waitForDsrEQ(0x80,0x80,100);
      ZvgIO.ecpDcrState = ZvgIO.ecpDcrState & 0xfe;
      out((undefined2)ZvgIO.ecpDcr,ZvgIO.ecpDcrState);
      uVar1 = 0;
      if (uVar2 == 0xffffffff) {
        uVar1 = 0x15;
      }
    }
  }
  return uVar1;
}

Assistant:

uint zvgSppPutc( uchar cc)
{
	// check for proper mode

	if (ZvgIO.ecpFlags & (ECPF_ECP | ECPF_NIBBLE))
		return (errEcpBadMode);	// this routine only works for SPP modes

	// wait for busy to go low

	if (waitForDsrEQ( DSR_Busy, 0, PERIPH_WAIT) == ZVG_TIMEOUT)
		return (errEcpBusy);		// Peripheral is apparently too busy for us

	// place data on bus, assume at least one cycle per access, wait for at least 1us

	outportb( ZvgIO.ecpData, cc);
	outportb( ZvgIO.ecpData, cc);
	outportb( ZvgIO.ecpData, cc);
	outportb( ZvgIO.ecpData, cc);

	cdcr( DCR_nStrobe);			// set strobe low

	// this wait is slightly outside the SPP compatibility standard.  But this assures
	// us that the ZVG (which is firmware based), has read the data.

	if (waitForDsrEQ( DSR_Busy, DSR_Busy, PERIPH_TIMEOUT) == ZVG_TIMEOUT)
	{	sdcr( DCR_nStrobe);		// set strobe back high
		return (errEcpTimeout);	// indicate error
	}
	sdcr( DCR_nStrobe);			// release strobe
	return (errOk);
}